

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O0

CloningFilter *
helics::make_cloning_filter
          (InterfaceVisibility locality,FilterTypes type,Federate *mFed,string_view delivery,
          string_view name)

{
  string_view endpoint;
  string_view inputType;
  string_view outputType;
  string_view inputType_00;
  string_view filterName;
  bool bVar1;
  CloningFilter *pCVar2;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *this;
  char *in_RCX;
  Federate *in_RDX;
  undefined4 in_ESI;
  int in_EDI;
  string_view in_stack_00000000;
  Core *in_stack_00000090;
  FilterTypes in_stack_0000009c;
  Filter *in_stack_000000a0;
  CloningFilter *dfilt;
  Federate *in_stack_ffffffffffffff50;
  char *pcVar3;
  Federate *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  string_view in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  char *local_38;
  Federate *in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  CloningFilter *pCVar4;
  Federate *pFVar5;
  
  pcVar3 = &stack0x00000008;
  if (in_EDI == 1) {
    local_38 = in_stack_00000000._M_str;
    pFVar5 = in_RDX;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffa8);
    inputType._M_str = in_stack_ffffffffffffff80;
    inputType._M_len = in_stack_ffffffffffffff78;
    outputType._M_str = in_stack_ffffffffffffffa8;
    outputType._M_len = in_stack_ffffffffffffffa0;
    pCVar2 = Federate::registerGlobalCloningFilter
                       (in_stack_ffffffffffffff70,in_stack_ffffffffffffff88,inputType,outputType);
    in_stack_ffffffffffffff50 = in_RDX;
    in_RDX = pFVar5;
  }
  else {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff88);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff78);
    filterName._M_len._4_4_ = in_EDI;
    filterName._M_len._0_4_ = in_ESI;
    filterName._M_str = in_RCX;
    inputType_00._M_str = (char *)in_RDX;
    inputType_00._M_len = in_stack_ffffffffffffffd8;
    pCVar2 = Federate::registerCloningFilter
                       (in_stack_ffffffffffffffd0,filterName,inputType_00,in_stack_00000000);
  }
  pCVar4 = pCVar2;
  this = (__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)Federate::getCorePointer(in_RDX);
  std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::get(this);
  addOperations(in_stack_000000a0,in_stack_0000009c,in_stack_00000090);
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffff0);
  if (!bVar1) {
    endpoint._M_str = pcVar3;
    endpoint._M_len = (size_t)pCVar2;
    CloningFilter::addDeliveryEndpoint((CloningFilter *)in_stack_ffffffffffffff50,endpoint);
  }
  return pCVar4;
}

Assistant:

CloningFilter& make_cloning_filter(InterfaceVisibility locality,
                                   FilterTypes type,
                                   Federate* mFed,
                                   std::string_view delivery,
                                   std::string_view name)

{
    auto& dfilt = (locality == InterfaceVisibility::GLOBAL) ?
        mFed->registerGlobalCloningFilter(name) :
        mFed->registerCloningFilter(name);
    addOperations(&dfilt, type, mFed->getCorePointer().get());
    if (!delivery.empty()) {
        dfilt.addDeliveryEndpoint(delivery);
    }
    return dfilt;
}